

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_15::ConsoleReporter::logTestStart(ConsoleReporter *this)

{
  pointer pSVar1;
  int iVar2;
  ostream *poVar3;
  TestCaseData *pTVar4;
  char *pcVar5;
  size_t i_1;
  TestCaseData *pTVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  
  if (this->hasLoggedCurrentTestStart == false) {
    separator_to_stream(this);
    pTVar4 = this->tc;
    pTVar6 = pTVar4;
    if ((pTVar4->m_file).field_0.buf[0x17] < '\0') {
      pTVar6 = (TestCaseData *)(pTVar4->m_file).field_0.data.ptr;
    }
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar6,(ulong)pTVar4->m_line,"\n");
    pTVar4 = this->tc;
    if (pTVar4->m_description != (char *)0x0) {
      poVar3 = this->s;
      Color::operator<<(poVar3,Yellow);
      poVar3 = std::operator<<(poVar3,"DESCRIPTION: ");
      Color::operator<<(poVar3,None);
      poVar3 = std::operator<<(poVar3,this->tc->m_description);
      std::operator<<(poVar3,"\n");
      pTVar4 = this->tc;
    }
    if ((pTVar4->m_test_suite != (char *)0x0) && (*pTVar4->m_test_suite != '\0')) {
      poVar3 = this->s;
      Color::operator<<(poVar3,Yellow);
      poVar3 = std::operator<<(poVar3,"TEST SUITE: ");
      Color::operator<<(poVar3,None);
      poVar3 = std::operator<<(poVar3,this->tc->m_test_suite);
      std::operator<<(poVar3,"\n");
      pTVar4 = this->tc;
    }
    iVar2 = strncmp(pTVar4->m_name,"  Scenario:",0xb);
    if (iVar2 != 0) {
      poVar3 = this->s;
      Color::operator<<(poVar3,Yellow);
      std::operator<<(poVar3,"TEST CASE:  ");
    }
    poVar3 = this->s;
    lVar7 = 0;
    Color::operator<<(poVar3,None);
    poVar3 = std::operator<<(poVar3,this->tc->m_name);
    std::operator<<(poVar3,"\n");
    for (uVar8 = 0; uVar8 < this->currentSubcaseLevel; uVar8 = uVar8 + 1) {
      pSVar1 = (this->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pSVar1->m_name).field_0.buf[lVar7 + 0x17] < '\0') {
        pcVar5 = *(char **)((long)&(pSVar1->m_name).field_0 + lVar7);
      }
      else {
        pcVar5 = (pSVar1->m_name).field_0.buf + lVar7;
      }
      if (*pcVar5 != '\0') {
        poVar3 = std::operator<<(this->s,"  ");
        poVar3 = doctest::operator<<(poVar3,(String *)
                                            ((long)&(((this->subcasesStack).
                                                                                                            
                                                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_name
                                                  ).field_0 + lVar7));
        std::operator<<(poVar3,"\n");
      }
      lVar7 = lVar7 + 0x28;
    }
    if (this->currentSubcaseLevel !=
        ((long)(this->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->subcasesStack).
              super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x28) {
      poVar3 = this->s;
      Color::operator<<(poVar3,Yellow);
      poVar3 = std::operator<<(poVar3,
                               "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n"
                              );
      lVar7 = 0;
      Color::operator<<(poVar3,None);
      for (uVar8 = 0;
          pSVar1 = (this->subcasesStack).
                   super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar8 < (ulong)(((long)(this->subcasesStack).
                                 super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28);
          uVar8 = uVar8 + 1) {
        if ((pSVar1->m_name).field_0.buf[lVar7 + 0x17] < '\0') {
          pcVar5 = *(char **)((long)&(pSVar1->m_name).field_0 + lVar7);
        }
        else {
          pcVar5 = (pSVar1->m_name).field_0.buf + lVar7;
        }
        if (*pcVar5 != '\0') {
          poVar3 = std::operator<<(this->s,"  ");
          poVar3 = doctest::operator<<(poVar3,(String *)
                                              ((long)&(((this->subcasesStack).
                                                                                                                
                                                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_name
                                                  ).field_0 + lVar7));
          std::operator<<(poVar3,"\n");
        }
        lVar7 = lVar7 + 0x28;
      }
    }
    std::operator<<(this->s,"\n");
    this->hasLoggedCurrentTestStart = true;
  }
  return;
}

Assistant:

void logTestStart() {
            if(hasLoggedCurrentTestStart)
                return;

            separator_to_stream();
            file_line_to_stream(tc->m_file.c_str(), tc->m_line, "\n");
            if(tc->m_description)
                s << Color::Yellow << "DESCRIPTION: " << Color::None << tc->m_description << "\n";
            if(tc->m_test_suite && tc->m_test_suite[0] != '\0')
                s << Color::Yellow << "TEST SUITE: " << Color::None << tc->m_test_suite << "\n";
            if(strncmp(tc->m_name, "  Scenario:", 11) != 0)
                s << Color::Yellow << "TEST CASE:  ";
            s << Color::None << tc->m_name << "\n";

            for(size_t i = 0; i < currentSubcaseLevel; ++i) {
                if(subcasesStack[i].m_name[0] != '\0')
                    s << "  " << subcasesStack[i].m_name << "\n";
            }

            if(currentSubcaseLevel != subcasesStack.size()) {
                s << Color::Yellow << "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n" << Color::None;
                for(size_t i = 0; i < subcasesStack.size(); ++i) {
                    if(subcasesStack[i].m_name[0] != '\0')
                        s << "  " << subcasesStack[i].m_name << "\n";
                }
            }

            s << "\n";

            hasLoggedCurrentTestStart = true;
        }